

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O0

ssize_t __thiscall amrex::BndryRegister::write(BndryRegister *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  void *__buf_00;
  undefined4 in_register_00000034;
  string facename;
  int i;
  OrientationIter face;
  ostream *in_stack_00000110;
  BoxArray *in_stack_00000118;
  int in_stack_00000150;
  int in_stack_00000154;
  string *in_stack_00000158;
  OrientationIter *in_stack_ffffffffffffff78;
  Orientation local_78 [3];
  char in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_48 [36];
  Orientation local_24;
  int local_20;
  OrientationIter local_1c;
  ostream *local_18;
  undefined8 local_10;
  BndryRegister *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_18 = (ostream *)__buf;
  local_8 = this;
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    BoxArray::writeOn(in_stack_00000118,in_stack_00000110);
    std::operator<<(local_18,'\n');
  }
  OrientationIter::OrientationIter(&local_1c);
  while (pvVar3 = OrientationIter::operator_cast_to_void_(&local_1c), pvVar3 != (void *)0x0) {
    local_24 = OrientationIter::operator()(in_stack_ffffffffffffff78);
    local_20 = Orientation::operator_cast_to_int(&local_24);
    in_stack_ffffffffffffff78 = (OrientationIter *)&stack0xffffffffffffff98;
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff97);
    Concatenate(in_stack_00000158,in_stack_00000154,in_stack_00000150);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    local_78[0] = OrientationIter::operator()(in_stack_ffffffffffffff78);
    iVar2 = Orientation::operator_cast_to_int(local_78);
    FabSet::write(this->bndry + iVar2,(int)local_48,__buf_00,(long)iVar2 * 0x180);
    std::__cxx11::string::~string(local_48);
    OrientationIter::operator++(&local_1c);
  }
  return 0;
}

Assistant:

void
BndryRegister::write (const std::string& name, std::ostream& os) const
{
    if (ParallelDescriptor::IOProcessor())
    {
        grids.writeOn(os);
        os << '\n';
    }

    for (OrientationIter face; face; ++face)
    {
        //
        // Take name here and make a "new" name unique to each face.
        // Simplest thing would probably to append "_n" to the name,
        // where n is the integer value of face().
        //
        const int i = face();
        BL_ASSERT(i >= 0 && i <= 7);

        std::string facename = amrex::Concatenate(name + '_', i, 1);

        bndry[face()].write(facename);
    }
}